

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

void tcase_set_timeout(TCase *tc,double timeout)

{
  char *__nptr;
  double dVar1;
  char *endptr;
  char *local_18;
  
  if (0.0 <= timeout) {
    __nptr = getenv("CK_TIMEOUT_MULTIPLIER");
    if (__nptr != (char *)0x0) {
      local_18 = (char *)0x0;
      dVar1 = strtod(__nptr,&local_18);
      if (((0.0 <= dVar1) && (local_18 != __nptr)) && (*local_18 == '\0')) {
        timeout = timeout * dVar1;
      }
    }
    dVar1 = floor(timeout);
    (tc->timeout).tv_sec = (long)dVar1;
    (tc->timeout).tv_nsec = (long)((timeout - dVar1) * 1000000000.0);
  }
  return;
}

Assistant:

void tcase_set_timeout(TCase * tc, double timeout)
{
#if defined(HAVE_FORK)
    if(timeout >= 0)
    {
        char *env = getenv("CK_TIMEOUT_MULTIPLIER");

        if(env != NULL)
        {
            char *endptr = NULL;
            double tmp = strtod(env, &endptr);

            if(tmp >= 0 && endptr != env && (*endptr) == '\0')
            {
                timeout = timeout * tmp;
            }
        }

        tc->timeout.tv_sec = (time_t) floor(timeout);
        tc->timeout.tv_nsec =
            (long)((timeout - floor(timeout)) * (double)NANOS_PER_SECONDS);
    }
#else
    (void)tc;
    (void)timeout;
    /* Ignoring, as Check is not compiled with fork support. */
#endif /* HAVE_FORK */
}